

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

bool tinyusdz::tydra::(anonymous_namespace)::
     TryConvertFacevaryingToVertexFloat<tinyusdz::value::half,float>
               (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *src,
               vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,float eps)

{
  half h;
  pointer phVar1;
  ulong uVar2;
  pointer puVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  __node_base _Var6;
  uint uVar7;
  size_type __new_size;
  bool bVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  uint32_t vidx;
  unordered_map<unsigned_int,_tinyusdz::value::half,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>_>
  vdata;
  uint local_8c;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *local_88;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *local_80;
  float local_78;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (dst == (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)0x0) {
    bVar9 = false;
  }
  else {
    uVar2 = (long)(faceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(faceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    bVar9 = false;
    if (((long)(src->
               super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(src->
               super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
               _M_impl.super__Vector_impl_data._M_start >> 1 == uVar2) && (2 < uVar2)) {
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      puVar3 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      bVar9 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
              _M_impl.super__Vector_impl_data._M_finish == puVar3;
      if (bVar9) {
        __new_size = 1;
      }
      else {
        uVar2 = 0;
        uVar7 = 0;
        local_88 = src;
        local_80 = dst;
        do {
          local_8c = puVar3[uVar2];
          if (uVar7 < local_8c) {
            uVar7 = local_8c;
          }
          sVar4 = ::std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count(&local_68,&local_8c);
          if (sVar4 == 0) {
            phVar1 = (local_88->
                     super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pmVar5 = ::std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&local_68,&local_8c);
            pmVar5->value = phVar1[uVar2].value;
          }
          else {
            pmVar5 = ::std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&local_68,&local_8c);
            h.value = (local_88->
                      super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar2].value;
            local_78 = tinyusdz::value::half_to_float((half)pmVar5->value);
            fVar10 = tinyusdz::value::half_to_float(h);
            if (eps < ABS(local_78 - fVar10)) {
              fVar13 = ABS(local_78);
              fVar11 = ABS(fVar10);
              fVar12 = fVar11;
              if (fVar11 <= fVar13) {
                fVar12 = fVar13;
              }
              if ((float)(~-(uint)NAN(fVar13) & (uint)fVar12 | -(uint)NAN(fVar13) & (uint)fVar11) *
                  eps < ABS(local_78 - fVar10)) goto LAB_00387e53;
            }
          }
          uVar2 = uVar2 + 1;
          puVar3 = (faceVertexIndices->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          bVar8 = uVar2 < (ulong)((long)(faceVertexIndices->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3
                                 >> 2);
          bVar9 = !bVar8;
        } while (bVar8);
        __new_size = (size_type)(uVar7 + 1);
        dst = local_80;
      }
      ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::resize
                (dst,__new_size);
      memset((dst->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
             )._M_impl.super__Vector_impl_data._M_start,0,__new_size * 2);
      if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        phVar1 = (dst->
                 super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        _Var6._M_nxt = local_68._M_before_begin._M_nxt;
        do {
          phVar1[*(uint *)&_Var6._M_nxt[1]._M_nxt].value =
               *(uint16_t *)((long)&_Var6._M_nxt[1]._M_nxt + 4);
          _Var6._M_nxt = (_Var6._M_nxt)->_M_nxt;
        } while (_Var6._M_nxt != (_Hash_node_base *)0x0);
      }
LAB_00387e53:
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
    }
  }
  return bVar9;
}

Assistant:

bool TryConvertFacevaryingToVertexFloat(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices, const EpsTy eps) {
  DCOUT("TryConvertFacevaryingToVertexFloat");
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    DCOUT("size mismatch.");
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!math::is_close(vdata[vidx], src[i], eps)) {
        DCOUT("diff at faceVertexIndices[" << i << "]");
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->resize(max_vidx + 1);
  memset(dst->data(), 0, (max_vidx + 1) * sizeof(T));

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}